

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O1

BOOLEAN __thiscall
BVSparse<Memory::JitArenaAllocator>::TestAndClear
          (BVSparse<Memory::JitArenaAllocator> *this,BVIndex i)

{
  Type *pTVar1;
  byte bVar2;
  BVSparseNode *pBVar3;
  bool bVar4;
  Type *local_38;
  Type *prevNextField;
  
  local_38 = (Type *)0x0;
  bVar4 = false;
  pBVar3 = NodeFromIndex(this,i,&local_38,false);
  if (pBVar3 != (BVSparseNode *)0x0) {
    BVUnitT<unsigned_long>::AssertRange(i & 0x3f);
    bVar4 = ((pBVar3->data).word >> ((ulong)i & 0x3f) & 1) != 0;
    BVUnitT<unsigned_long>::AssertRange(i & 0x3f);
    bVar2 = (byte)i & 0x3f;
    pTVar1 = &pBVar3->data;
    pTVar1->word = pTVar1->word & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
    if (pTVar1->word == 0) {
      pBVar3 = DeleteNode(this,pBVar3,false);
      *local_38 = pBVar3;
    }
  }
  return bVar4;
}

Assistant:

BOOLEAN
BVSparse<TAllocator>::TestAndClear(BVIndex i)
{
    Field(BVSparseNode*, TAllocator)* prevNextField = nullptr;
    BVSparseNode * current = this->NodeFromIndex(i, &prevNextField, false /* create */);
    if (current == nullptr)
    {
        return false;
    }
    BVIndex bvIndex = SparseBVUnit::Offset(i);
    BOOLEAN bit = current->data.Test(bvIndex);
    current->data.Clear(bvIndex);
    if (current->data.IsEmpty())
    {
        *prevNextField = this->DeleteNode(current, false);
    }
    return bit;
}